

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_program
xmrig::OclLib::createProgramWithBinary
          (cl_context context,cl_uint num_devices,cl_device_id *device_list,size_t *lengths,
          uchar **binaries,cl_int *binary_status,cl_int *errcode_ret)

{
  char *fmt;
  char *pcVar1;
  size_t *in_RCX;
  cl_device_id *in_RDX;
  cl_uint in_ESI;
  cl_context in_RDI;
  uchar **in_R8;
  cl_int *in_R9;
  cl_int *in_stack_00000008;
  cl_program result;
  cl_program local_8;
  
  local_8 = (*pCreateProgramWithBinary)(in_RDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  fmt = kErrorTemplate;
  if (*in_stack_00000008 != 0) {
    pcVar1 = OclError::toString(*in_stack_00000008);
    Log::print(ERR,fmt,pcVar1,kCreateProgramWithBinary);
    local_8 = (cl_program)0x0;
  }
  return local_8;
}

Assistant:

cl_program xmrig::OclLib::createProgramWithBinary(cl_context context, cl_uint num_devices, const cl_device_id *device_list, const size_t *lengths, const unsigned char **binaries, cl_int *binary_status, cl_int *errcode_ret) noexcept
{
    assert(pCreateProgramWithBinary != nullptr);

    auto result = pCreateProgramWithBinary(context, num_devices, device_list, lengths, binaries, binary_status, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateProgramWithBinary);

        return nullptr;
    }

    return result;
}